

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall
embree::OBJMaterial::OBJMaterial
          (OBJMaterial *this,float d,shared_ptr<embree::Texture> *map_d,Vec3fa *Ka,
          shared_ptr<embree::Texture> *map_Ka,Vec3fa *Kd,shared_ptr<embree::Texture> *map_Kd,
          Vec3fa *Ks,shared_ptr<embree::Texture> *map_Ks,Vec3fa *Kt,
          shared_ptr<embree::Texture> *map_Kt,float Ns,shared_ptr<embree::Texture> *map_Ns,
          shared_ptr<embree::Texture> *map_Displ)

{
  undefined8 uVar1;
  allocator local_61;
  float local_60;
  float local_5c;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50;
  
  local_60 = d;
  local_5c = Ns;
  local_58 = &map_Kd->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
  std::__cxx11::string::string((string *)&local_50,"",&local_61);
  SceneGraph::MaterialNode::MaterialNode(&this->super_MaterialNode,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__OBJMaterial_002a6ac8;
  (this->base).type = 0;
  this->illum = 0;
  this->d = local_60;
  this->Ns = local_5c;
  this->Ni = 1.0;
  uVar1 = *(undefined8 *)((long)&Ka->field_0 + 8);
  *(undefined8 *)&(this->Ka).field_0 = *(undefined8 *)&Ka->field_0;
  *(undefined8 *)((long)&(this->Ka).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&Kd->field_0 + 8);
  *(undefined8 *)&(this->Kd).field_0 = *(undefined8 *)&Kd->field_0;
  *(undefined8 *)((long)&(this->Kd).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&Ks->field_0 + 8);
  *(undefined8 *)&(this->Ks).field_0 = *(undefined8 *)&Ks->field_0;
  *(undefined8 *)((long)&(this->Ks).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&Kt->field_0 + 8);
  *(undefined8 *)&(this->Kt).field_0 = *(undefined8 *)&Kt->field_0;
  *(undefined8 *)((long)&(this->Kt).field_0 + 8) = uVar1;
  this->map_d = (Texture *)0x0;
  this->map_Ka = (Texture *)0x0;
  this->map_Kd = (Texture *)0x0;
  this->map_Ks = (Texture *)0x0;
  this->map_Kt = (Texture *)0x0;
  this->map_Ns = (Texture *)0x0;
  this->map_Displ = (Texture *)0x0;
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_map_d).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>,
             &map_d->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_map_Ka).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>,
             &map_Ka->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_map_Kd).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>,
             local_58);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_map_Ks).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>,
             &map_Ks->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_map_Kt).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>,
             &map_Kt->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_map_Ns).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>,
             &map_Ns->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_map_Displ).super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>,
             &map_Displ->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

OBJMaterial (float d, const std::shared_ptr<Texture> map_d,
                 const Vec3fa& Ka, const std::shared_ptr<Texture> map_Ka, 
                 const Vec3fa& Kd, const std::shared_ptr<Texture> map_Kd, 
                 const Vec3fa& Ks, const std::shared_ptr<Texture> map_Ks,
                 const Vec3fa& Kt, const std::shared_ptr<Texture> map_Kt, 
                 const float Ns, const std::shared_ptr<Texture> map_Ns, 
                 const std::shared_ptr<Texture> map_Displ)
      : base(MATERIAL_OBJ), illum(0), d(d), Ns(Ns), Ni(1.f), Ka(Ka), Kd(Kd), Ks(Ks), Kt(Kt), 
      map_d(nullptr), map_Ka(nullptr), map_Kd(nullptr), map_Ks(nullptr), map_Kt(nullptr), map_Ns(nullptr), map_Displ(nullptr),
      _map_d(map_d), _map_Ka(map_Ka), _map_Kd(map_Kd), _map_Ks(map_Ks), _map_Kt(map_Kt), _map_Ns(map_Ns), _map_Displ(map_Displ) {}